

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,std::variant<google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>>,absl::lts_20240722::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::variant<google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>>>>
::
emplace_at<std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<google::protobuf::json_internal::UntypedMessage&&>>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,std::variant<google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>>,absl::lts_20240722::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::variant<google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>>>>
           *this,iterator iter,piecewise_construct_t *args,tuple<const_int_&> *args_1,
          tuple<google::protobuf::json_internal::UntypedMessage_&&> *args_2)

{
  UntypedMessage *pUVar1;
  bool bVar2;
  reference key;
  anon_union_8_1_a8a14541_for_iterator_2 aVar3;
  iterator local_48;
  iterator local_38;
  iterator local_28;
  
  aVar3 = iter.field_1;
  local_28.ctrl_ = iter.ctrl_;
  pUVar1 = (args_2->super__Tuple_impl<0UL,_google::protobuf::json_internal::UntypedMessage_&&>).
           super__Head_base<0UL,_google::protobuf::json_internal::UntypedMessage_&&,_false>.
           _M_head_impl;
  *(int *)aVar3.slot_ =
       *(args_1->super__Tuple_impl<0UL,_const_int_&>).super__Head_base<0UL,_const_int_&,_false>.
        _M_head_impl;
  *(Message **)((long)aVar3.slot_ + 8) = pUVar1->desc_;
  local_28.field_1 = aVar3;
  raw_hash_set<$2385b75b$>::raw_hash_set
            ((raw_hash_set<_2385b75b_> *)((long)aVar3.slot_ + 0x10),
             (raw_hash_set<_2385b75b_> *)&pUVar1->fields_);
  *(undefined1 *)((long)aVar3.slot_ + 0x30) = 8;
  key = raw_hash_set<$2385b75b$>::iterator::operator*(&local_28);
  local_38 = raw_hash_set<$2385b75b$>::find<int>((raw_hash_set<_2385b75b_> *)this,&key->first);
  local_48.ctrl_ = local_28.ctrl_;
  local_48.field_1.slot_ = (slot_type *)local_28.field_1;
  bVar2 = container_internal::operator==(&local_38,&local_48);
  if (bVar2) {
    return;
  }
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xf3f,
                "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, std::variant<google::protobuf::json_internal::UntypedMessage::Bool, int, unsigned int, long, unsigned long, float, double, std::basic_string<char>, google::protobuf::json_internal::UntypedMessage, std::vector<google::protobuf::json_internal::UntypedMessage::Bool>, std::vector<int>, std::vector<unsigned int>, std::vector<long>, std::vector<unsigned long>, std::vector<float>, std::vector<double>, std::vector<std::basic_string<char>>, std::vector<google::protobuf::json_internal::UntypedMessage>>>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, std::variant<google::protobuf::json_internal::UntypedMessage::Bool, int, unsigned int, long, unsigned long, float, double, std::basic_string<char>, google::protobuf::json_internal::UntypedMessage, std::vector<google::protobuf::json_internal::UntypedMessage::Bool>, std::vector<int>, std::vector<unsigned int>, std::vector<long>, std::vector<unsigned long>, std::vector<float>, std::vector<double>, std::vector<std::basic_string<char>>, std::vector<google::protobuf::json_internal::UntypedMessage>>>>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashMapPolicy<int, std::variant<google::protobuf::json_internal::UntypedMessage::Bool, int, unsigned int, long, unsigned long, float, double, std::basic_string<char>, google::protobuf::json_internal::UntypedMessage, std::vector<google::protobuf::json_internal::UntypedMessage::Bool>, std::vector<int>, std::vector<unsigned int>, std::vector<long>, std::vector<unsigned long>, std::vector<float>, std::vector<double>, std::vector<std::basic_string<char>>, std::vector<google::protobuf::json_internal::UntypedMessage>>>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, std::variant<google::protobuf::json_internal::UntypedMessage::Bool, int, unsigned int, long, unsigned long, float, double, std::basic_string<char>, google::protobuf:..." /* TRUNCATED STRING LITERAL */
               );
}

Assistant:

void emplace_at(iterator iter, Args&&... args) {
    construct(iter.slot(), std::forward<Args>(args)...);

    assert(PolicyTraits::apply(FindElement{*this}, *iter) == iter &&
           "constructed value does not match the lookup key");
  }